

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *this_01;
  Container *in_RCX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  char **in_stack_fffffffffffffee8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_fffffffffffffef0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff30;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *in_stack_ffffffffffffff58;
  JSONW *in_stack_ffffffffffffff60;
  BasicConstraintKeeper *in_stack_ffffffffffffffa0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  Container *local_20;
  
  local_20 = in_RCX;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
            (&local_30,in_RSI);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)
            BasicConstraintKeeper::GetShortTypeName(in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x484f95);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x484ff4);
  Container::GetCon((Container *)0x485001);
  this_01 = (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
            BasicConstraint::name((BasicConstraint *)0x485009);
  if (*(char *)&this_01->wrt_ != '\0') {
    Container::GetCon((Container *)0x48502b);
    in_stack_fffffffffffffee8 = (char **)BasicConstraint::name((BasicConstraint *)0x485033);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              (this_01,in_stack_fffffffffffffee8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x485092);
  }
  Container::GetDepth(local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (this_01,(int *)in_stack_fffffffffffffee8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x48517a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  Container::GetCon((Container *)0x4851b6);
  WriteJSON<mp::LinTerms,mp::AlgConRange>(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x4851cf);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x4851dc);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }